

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evpath_dp.c
# Opt level: O0

DP_WS_Stream
EvpathInitWriter(CP_Services Svcs,void *CP_Stream,_SstParams *Params,attr_list DPAttrs,
                SstStats Stats)

{
  void *__s;
  undefined8 uVar1;
  SMPI_Comm comm_00;
  undefined8 uVar2;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_R8;
  CMFormat F;
  SMPI_Comm comm;
  CManager cm;
  Evpath_WS_Stream Stream;
  int *in_stack_ffffffffffffffb8;
  
  __s = malloc(0x70);
  uVar1 = (**(code **)(in_RDI + 8))(in_RSI);
  comm_00 = (SMPI_Comm)(**(code **)(in_RDI + 0x18))(in_RSI);
  memset(__s,0,0x70);
  pthread_mutex_init((pthread_mutex_t *)((long)__s + 0x18),(pthread_mutexattr_t *)0x0);
  SMPI_Comm_rank(comm_00,in_stack_ffffffffffffffb8);
  *(undefined8 *)((long)__s + 8) = in_RSI;
  *(undefined8 *)((long)__s + 0x68) = in_R8;
  uVar2 = CMregister_format(uVar1,EvpathReadRequestStructs);
  CMregister_handler(uVar2,EvpathReadRequestHandler,in_RDI);
  uVar2 = CMregister_format(uVar1,EvpathPreloadStructs);
  *(undefined8 *)((long)__s + 0x50) = uVar2;
  uVar1 = CMregister_format(uVar1,EvpathReadReplyStructs);
  *(undefined8 *)((long)__s + 0x48) = uVar1;
  return __s;
}

Assistant:

static DP_WS_Stream EvpathInitWriter(CP_Services Svcs, void *CP_Stream, struct _SstParams *Params,
                                     attr_list DPAttrs, SstStats Stats)
{
    Evpath_WS_Stream Stream = malloc(sizeof(struct _Evpath_WS_Stream));
    CManager cm = Svcs->getCManager(CP_Stream);
    SMPI_Comm comm = Svcs->getMPIComm(CP_Stream);
    CMFormat F;

    memset(Stream, 0, sizeof(struct _Evpath_WS_Stream));

    pthread_mutex_init(&Stream->DataLock, NULL);

    SMPI_Comm_rank(comm, &Stream->Rank);

    /*
     * save the CP_stream value of later use
     */
    Stream->CP_Stream = CP_Stream;
    Stream->Stats = Stats;

    /*
     * add a handler for read request messages
     */
    F = CMregister_format(cm, EvpathReadRequestStructs);
    CMregister_handler(F, EvpathReadRequestHandler, Svcs);

    /*
     * Register for sending preload messages
     */
    Stream->PreloadFormat = CMregister_format(cm, EvpathPreloadStructs);
    /*
     * register read reply message structure so we can send later
     */
    Stream->ReadReplyFormat = CMregister_format(cm, EvpathReadReplyStructs);

    //   We'd set an attribute here if we needed to communicate it to possible
    //   readers
    //    set_int_attr(DPAttrs, attr_atom_from_string("EVPATH_DP_Attr"),
    //    0xdeadbeef);

    return (void *)Stream;
}